

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeImpl.cpp
# Opt level: O0

XMLCh * __thiscall
xercesc_4_0::DOMNodeImpl::getTextContent
          (DOMNodeImpl *this,XMLCh *pzBuffer,XMLSize_t *rnBufferLength)

{
  int iVar1;
  undefined4 extraout_var;
  DOMNodeImpl *pDVar2;
  undefined4 extraout_var_00;
  DOMNode *local_78;
  XMLSize_t nContentLength_2;
  XMLSize_t nStrLen;
  XMLCh *pzValue;
  XMLSize_t nContentLength_1;
  XMLSize_t nContentLength;
  DOMNode *current;
  DOMNode *thisNode;
  XMLSize_t nRemainingBuffer;
  XMLSize_t *rnBufferLength_local;
  XMLCh *pzBuffer_local;
  DOMNodeImpl *this_local;
  
  thisNode = (DOMNode *)*rnBufferLength;
  *rnBufferLength = 0;
  if (pzBuffer != (XMLCh *)0x0) {
    *pzBuffer = L'\0';
  }
  nRemainingBuffer = (XMLSize_t)rnBufferLength;
  rnBufferLength_local = (XMLSize_t *)pzBuffer;
  pzBuffer_local = (XMLCh *)this;
  current = getContainingNode(this);
  iVar1 = (*current->_vptr_DOMNode[4])();
  if (iVar1 != 1) {
    if (iVar1 - 2U < 3) {
LAB_00304551:
      iVar1 = (*current->_vptr_DOMNode[3])();
      local_78 = (DOMNode *)XMLString::stringLen((XMLCh *)CONCAT44(extraout_var_00,iVar1));
      if (rnBufferLength_local != (XMLSize_t *)0x0) {
        if (thisNode < local_78) {
          local_78 = thisNode;
        }
        XMLString::copyNString
                  ((XMLCh *)((long)rnBufferLength_local + *(long *)nRemainingBuffer * 2),
                   (XMLCh *)CONCAT44(extraout_var_00,iVar1),(XMLSize_t)local_78);
        *(long *)nRemainingBuffer = (long)&local_78->_vptr_DOMNode + *(long *)nRemainingBuffer;
        return (XMLCh *)rnBufferLength_local;
      }
      *(long *)nRemainingBuffer = (long)&local_78->_vptr_DOMNode + *(long *)nRemainingBuffer;
      return (XMLCh *)0x0;
    }
    if (1 < iVar1 - 5U) {
      if (iVar1 - 7U < 2) goto LAB_00304551;
      if (iVar1 != 0xb) {
        return (XMLCh *)rnBufferLength_local;
      }
    }
  }
  iVar1 = (*current->_vptr_DOMNode[7])();
  for (nContentLength = CONCAT44(extraout_var,iVar1); nContentLength != 0;
      nContentLength = (**(code **)(*(long *)nContentLength + 0x50))()) {
    iVar1 = (**(code **)(*(long *)nContentLength + 0x20))();
    if ((iVar1 != 8) && (iVar1 = (**(code **)(*(long *)nContentLength + 0x20))(), iVar1 != 7)) {
      if (rnBufferLength_local == (XMLSize_t *)0x0) {
        pzValue = (XMLCh *)0x0;
        pDVar2 = xercesc_4_0::castToNodeImpl((DOMNode *)nContentLength);
        getTextContent(pDVar2,(XMLCh *)0x0,(XMLSize_t *)&pzValue);
        *(long *)nRemainingBuffer = (long)pzValue + *(long *)nRemainingBuffer;
      }
      else {
        nContentLength_1 = (XMLSize_t)thisNode;
        pDVar2 = xercesc_4_0::castToNodeImpl((DOMNode *)nContentLength);
        getTextContent(pDVar2,(XMLCh *)((long)rnBufferLength_local + *(long *)nRemainingBuffer * 2),
                       &nContentLength_1);
        *(XMLSize_t *)nRemainingBuffer = nContentLength_1 + *(long *)nRemainingBuffer;
        thisNode = (DOMNode *)((long)thisNode - nContentLength_1);
      }
    }
  }
  return (XMLCh *)rnBufferLength_local;
}

Assistant:

const XMLCh*    DOMNodeImpl::getTextContent(XMLCh* pzBuffer, XMLSize_t& rnBufferLength) const
{
	XMLSize_t nRemainingBuffer = rnBufferLength;
	rnBufferLength = 0;

	if (pzBuffer)
		*pzBuffer = 0;

	const DOMNode *thisNode = getContainingNode();

	switch (thisNode->getNodeType())
	{
	case DOMNode::ELEMENT_NODE:
    case DOMNode::ENTITY_NODE:
    case DOMNode::ENTITY_REFERENCE_NODE:
    case DOMNode::DOCUMENT_FRAGMENT_NODE:
    {
		DOMNode* current = thisNode->getFirstChild();

		while (current != NULL)
		{
			if (current->getNodeType() != DOMNode::COMMENT_NODE &&
				current->getNodeType() != DOMNode::PROCESSING_INSTRUCTION_NODE)
			{

				if (pzBuffer)
				{
					XMLSize_t nContentLength = nRemainingBuffer;
					castToNodeImpl(current)->getTextContent(pzBuffer + rnBufferLength, nContentLength);
					rnBufferLength += nContentLength;
					nRemainingBuffer -= nContentLength;
				}
				else
				{
					XMLSize_t nContentLength = 0;
					castToNodeImpl(current)->getTextContent(NULL, nContentLength);
					rnBufferLength += nContentLength;
				}
			}

			current = current->getNextSibling();

		}
    }

    break;

    case DOMNode::ATTRIBUTE_NODE:
    case DOMNode::TEXT_NODE:
    case DOMNode::CDATA_SECTION_NODE:
    case DOMNode::COMMENT_NODE:
    case DOMNode::PROCESSING_INSTRUCTION_NODE:
    {
		const XMLCh* pzValue = thisNode->getNodeValue();
		XMLSize_t nStrLen = XMLString::stringLen(pzValue);

		if (pzBuffer)
		{
			XMLSize_t nContentLength = (nRemainingBuffer >= nStrLen) ? nStrLen : nRemainingBuffer;
			XMLString::copyNString(pzBuffer + rnBufferLength, pzValue, nContentLength);
			rnBufferLength += nContentLength;
			nRemainingBuffer -= nContentLength;
		}
		else
		{
			rnBufferLength += nStrLen;
		}

    }

    break;

	/***
         DOCUMENT_NODE
		 DOCUMENT_TYPE_NODE
		 NOTATION_NODE
	***/
	default:

		break;
	}

	return pzBuffer;

}